

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void color_sycc_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  opj_image_comp_t *poVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  undefined1 auVar7 [16];
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  OPJ_INT32 *pOVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  
  if (img->numcomps < 3) {
    img->color_space = OPJ_CLRSPC_GRAY;
  }
  else {
    poVar3 = img->comps;
    if (poVar3->dx == 1) {
      if (poVar3[1].dx == 1) {
        if ((((poVar3[2].dx == 1) && (poVar3->dy == 1)) && (poVar3[1].dy == 1)) &&
           (poVar3[2].dy == 1)) {
          bVar1 = (byte)poVar3->prec;
          iVar14 = -1 << (bVar1 - 1 & 0x1f);
          lVar18 = (ulong)poVar3->h * (ulong)poVar3->w;
          pOVar4 = poVar3->data;
          pOVar5 = poVar3[1].data;
          pOVar6 = poVar3[2].data;
          uVar16 = lVar18 * 4;
          pOVar8 = (OPJ_INT32 *)opj_image_data_alloc(uVar16);
          pOVar9 = (OPJ_INT32 *)opj_image_data_alloc(uVar16);
          pOVar10 = (OPJ_INT32 *)opj_image_data_alloc();
          if (pOVar10 != (OPJ_INT32 *)0x0 &&
              (pOVar9 != (OPJ_INT32 *)0x0 && pOVar8 != (OPJ_INT32 *)0x0)) {
            if (lVar18 != 0) {
              uVar13 = ~(-1 << (bVar1 & 0x1f));
              lVar11 = 0;
              do {
                iVar2 = pOVar4[lVar11];
                dVar21 = (double)(pOVar5[lVar11] + iVar14);
                dVar22 = (double)(pOVar6[lVar11] + iVar14);
                uVar19 = iVar2 + (int)(dVar21 * 1.772);
                uVar20 = iVar2 + (int)(dVar22 * 1.402);
                uVar15 = uVar20;
                if ((int)uVar13 <= (int)uVar20) {
                  uVar15 = uVar13;
                }
                auVar7._4_4_ = uVar19;
                auVar7._0_4_ = uVar19;
                auVar7._8_4_ = uVar20;
                auVar7._12_4_ = uVar20;
                uVar20 = movmskpd((int)uVar16,auVar7);
                uVar16 = (ulong)uVar20;
                if ((uVar20 & 2) != 0) {
                  uVar15 = 0;
                }
                uVar12 = iVar2 - (int)(dVar21 * 0.344 + dVar22 * 0.714);
                uVar17 = uVar13;
                if ((int)uVar12 < (int)uVar13) {
                  uVar17 = uVar12;
                }
                if ((int)uVar12 < 0) {
                  uVar17 = 0;
                }
                if ((int)uVar13 <= (int)uVar19) {
                  uVar19 = uVar13;
                }
                pOVar8[lVar11] = uVar15;
                if ((uVar20 & 1) != 0) {
                  uVar19 = 0;
                }
                pOVar9[lVar11] = uVar17;
                pOVar10[lVar11] = uVar19;
                lVar11 = lVar11 + 1;
              } while (lVar18 - lVar11 != 0);
            }
            opj_image_data_free(img->comps->data);
            poVar3 = img->comps;
            poVar3->data = pOVar8;
            opj_image_data_free(poVar3[1].data);
            poVar3 = img->comps;
            poVar3[1].data = pOVar9;
            opj_image_data_free(poVar3[2].data);
            img->comps[2].data = pOVar10;
            img->color_space = OPJ_CLRSPC_SRGB;
            return;
          }
          opj_image_data_free(pOVar8);
          opj_image_data_free(pOVar9);
          opj_image_data_free(pOVar10);
          return;
        }
      }
      else if (poVar3[1].dx == 2) {
        if (((poVar3[2].dx == 2) && (poVar3->dy == 1)) &&
           ((poVar3[1].dy == 2 && (poVar3[2].dy == 2)))) {
          sycc420_to_rgb(img);
          return;
        }
        if (((poVar3[2].dx == 2) && (poVar3->dy == 1)) &&
           ((poVar3[1].dy == 1 && (poVar3[2].dy == 1)))) {
          sycc422_to_rgb(img);
          return;
        }
      }
    }
    color_sycc_to_rgb_cold_1();
  }
  return;
}

Assistant:

void color_sycc_to_rgb(opj_image_t *img)
{
    if (img->numcomps < 3) {
        img->color_space = OPJ_CLRSPC_GRAY;
        return;
    }

    if ((img->comps[0].dx == 1)
            && (img->comps[1].dx == 2)
            && (img->comps[2].dx == 2)
            && (img->comps[0].dy == 1)
            && (img->comps[1].dy == 2)
            && (img->comps[2].dy == 2)) { /* horizontal and vertical sub-sample */
        sycc420_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 2)
               && (img->comps[2].dx == 2)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* horizontal sub-sample only */
        sycc422_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 1)
               && (img->comps[2].dx == 1)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* no sub-sample */
        sycc444_to_rgb(img);
    } else {
        fprintf(stderr, "%s:%d:color_sycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }
}